

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O1

void embree::avx::BVHNIntersector1<8,_257,_true,_embree::avx::VirtualCurveIntersector1>::occluded
               (Intersectors *This,Ray *ray,RayQueryContext *context)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar5;
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  bool bVar20;
  char cVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  int iVar25;
  ulong uVar26;
  long lVar27;
  NodeRef *pNVar28;
  ulong uVar29;
  ulong uVar30;
  ulong uVar31;
  undefined4 uVar32;
  ulong unaff_R15;
  undefined1 auVar33 [16];
  float fVar37;
  float fVar38;
  float fVar39;
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  float fVar40;
  undefined1 auVar36 [32];
  undefined1 auVar41 [16];
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  undefined1 auVar42 [32];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  float fVar50;
  float fVar51;
  float fVar52;
  float fVar53;
  undefined1 auVar49 [32];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [32];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  float fVar68;
  vfloat4 a0;
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [32];
  float fVar72;
  undefined1 auVar73 [32];
  float fVar74;
  float fVar78;
  float fVar79;
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  float fVar80;
  float fVar81;
  float fVar82;
  float fVar83;
  undefined1 auVar77 [32];
  float fVar84;
  float fVar88;
  float fVar89;
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  float fVar90;
  float fVar91;
  float fVar92;
  float fVar93;
  undefined1 auVar87 [32];
  float fVar94;
  float fVar98;
  float fVar99;
  undefined1 auVar95 [16];
  float fVar101;
  float fVar102;
  float fVar103;
  undefined1 auVar96 [32];
  float fVar100;
  undefined1 auVar97 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  Precalculations pre;
  NodeRef stack [564];
  undefined1 auVar57 [32];
  undefined1 auVar61 [32];
  undefined1 auVar67 [32];
  
  if (*(long *)&This->ptr[1].bounds.bounds0.lower.field_0 != 8) {
    fVar37 = ray->tfar;
    if (0.0 <= fVar37) {
      aVar5 = (ray->dir).field_0.field_1;
      auVar54 = vdpps_avx((undefined1  [16])aVar5,(undefined1  [16])aVar5,0x7f);
      auVar55 = vrsqrtss_avx(auVar54,auVar54);
      fVar68 = auVar55._0_4_;
      pre.depth_scale = fVar68 * 1.5 - auVar54._0_4_ * 0.5 * fVar68 * fVar68 * fVar68;
      fVar68 = (ray->dir).field_0.m128[0];
      fVar1 = (ray->dir).field_0.m128[1];
      fVar2 = (ray->dir).field_0.m128[2];
      auVar58 = vshufps_avx(ZEXT416((uint)pre.depth_scale),ZEXT416((uint)pre.depth_scale),0);
      auVar69._0_4_ = aVar5.x * auVar58._0_4_;
      auVar69._4_4_ = aVar5.y * auVar58._4_4_;
      auVar69._8_4_ = aVar5.z * auVar58._8_4_;
      auVar69._12_4_ = aVar5.field_3.w * auVar58._12_4_;
      auVar55 = vshufpd_avx(auVar69,auVar69,1);
      auVar54 = vmovshdup_avx(auVar69);
      auVar85._8_4_ = 0x80000000;
      auVar85._0_8_ = 0x8000000080000000;
      auVar85._12_4_ = 0x80000000;
      auVar70._12_4_ = 0;
      auVar70._0_12_ = ZEXT812(0);
      auVar70 = auVar70 << 0x20;
      auVar75 = vunpckhps_avx(auVar69,auVar70);
      auVar62 = vshufps_avx(auVar75,ZEXT416(auVar54._0_4_ ^ 0x80000000),0x41);
      auVar75._0_8_ = auVar55._0_8_ ^ 0x8000000080000000;
      auVar75._8_8_ = auVar55._8_8_ ^ auVar85._8_8_;
      auVar75 = vinsertps_avx(auVar75,auVar69,0x2a);
      auVar54 = vdpps_avx(auVar62,auVar62,0x7f);
      auVar55 = vdpps_avx(auVar75,auVar75,0x7f);
      auVar54 = vcmpps_avx(auVar55,auVar54,1);
      auVar54 = vshufps_avx(auVar54,auVar54,0);
      auVar54 = vblendvps_avx(auVar75,auVar62,auVar54);
      auVar55 = vdpps_avx(auVar54,auVar54,0x7f);
      auVar75 = vrsqrtss_avx(auVar55,auVar55);
      fVar72 = auVar75._0_4_;
      auVar55 = ZEXT416((uint)(fVar72 * 1.5 - auVar55._0_4_ * 0.5 * fVar72 * fVar72 * fVar72));
      auVar55 = vshufps_avx(auVar55,auVar55,0);
      auVar76._0_4_ = auVar54._0_4_ * auVar55._0_4_;
      auVar76._4_4_ = auVar54._4_4_ * auVar55._4_4_;
      auVar76._8_4_ = auVar54._8_4_ * auVar55._8_4_;
      auVar76._12_4_ = auVar54._12_4_ * auVar55._12_4_;
      auVar54 = vshufps_avx(auVar76,auVar76,0xc9);
      auVar55 = vshufps_avx(auVar69,auVar69,0xc9);
      auVar95._0_4_ = auVar55._0_4_ * auVar76._0_4_;
      auVar95._4_4_ = auVar55._4_4_ * auVar76._4_4_;
      auVar95._8_4_ = auVar55._8_4_ * auVar76._8_4_;
      auVar95._12_4_ = auVar55._12_4_ * auVar76._12_4_;
      auVar86._0_4_ = auVar54._0_4_ * auVar69._0_4_;
      auVar86._4_4_ = auVar54._4_4_ * auVar69._4_4_;
      auVar86._8_4_ = auVar54._8_4_ * auVar69._8_4_;
      auVar86._12_4_ = auVar54._12_4_ * auVar69._12_4_;
      auVar54 = vsubps_avx(auVar86,auVar95);
      auVar75 = vshufps_avx(auVar54,auVar54,0xc9);
      auVar54 = vdpps_avx(auVar75,auVar75,0x7f);
      auVar55 = vrsqrtss_avx(auVar54,auVar54);
      fVar72 = auVar55._0_4_;
      auVar54 = ZEXT416((uint)(fVar72 * 1.5 - fVar72 * fVar72 * fVar72 * auVar54._0_4_ * 0.5));
      auVar54 = vshufps_avx(auVar54,auVar54,0);
      auVar55._0_4_ = auVar75._0_4_ * auVar54._0_4_;
      auVar55._4_4_ = auVar75._4_4_ * auVar54._4_4_;
      auVar55._8_4_ = auVar75._8_4_ * auVar54._8_4_;
      auVar55._12_4_ = auVar75._12_4_ * auVar54._12_4_;
      auVar54._0_4_ = auVar58._0_4_ * auVar69._0_4_;
      auVar54._4_4_ = auVar58._4_4_ * auVar69._4_4_;
      auVar54._8_4_ = auVar58._8_4_ * auVar69._8_4_;
      auVar54._12_4_ = auVar58._12_4_ * auVar69._12_4_;
      auVar75 = vunpcklps_avx(auVar76,auVar54);
      auVar54 = vunpckhps_avx(auVar76,auVar54);
      auVar58 = vunpcklps_avx(auVar55,auVar70);
      auVar55 = vunpckhps_avx(auVar55,auVar70);
      pre.ray_space.vz.field_0 =
           (anon_union_16_2_47237d3f_for_Vec3fa_0)vunpcklps_avx(auVar54,auVar55);
      pre.ray_space.vx.field_0 =
           (anon_union_16_2_47237d3f_for_Vec3fa_0)vunpcklps_avx(auVar75,auVar58);
      pre.ray_space.vy.field_0 =
           (anon_union_16_2_47237d3f_for_Vec3fa_0)vunpckhps_avx(auVar75,auVar58);
      pNVar28 = stack + 1;
      auVar75 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->org).field_0.m128[3]));
      auVar58._8_4_ = 0x7fffffff;
      auVar58._0_8_ = 0x7fffffff7fffffff;
      auVar58._12_4_ = 0x7fffffff;
      auVar54 = vandps_avx((undefined1  [16])aVar5,auVar58);
      auVar62._8_4_ = 0x219392ef;
      auVar62._0_8_ = 0x219392ef219392ef;
      auVar62._12_4_ = 0x219392ef;
      auVar54 = vcmpps_avx(auVar54,auVar62,1);
      auVar63._8_4_ = 0x3f800000;
      auVar63._0_8_ = &DAT_3f8000003f800000;
      auVar63._12_4_ = 0x3f800000;
      auVar55 = vdivps_avx(auVar63,(undefined1  [16])aVar5);
      auVar64._8_4_ = 0x5d5e0b6b;
      auVar64._0_8_ = 0x5d5e0b6b5d5e0b6b;
      auVar64._12_4_ = 0x5d5e0b6b;
      auVar54 = vblendvps_avx(auVar55,auVar64,auVar54);
      stack[0].ptr = *(size_t *)&This->ptr[1].bounds.bounds0.lower.field_0;
      auVar65._0_4_ = auVar54._0_4_ * 0.99999964;
      auVar65._4_4_ = auVar54._4_4_ * 0.99999964;
      auVar65._8_4_ = auVar54._8_4_ * 0.99999964;
      auVar65._12_4_ = auVar54._12_4_ * 0.99999964;
      fVar72 = (ray->org).field_0.m128[0];
      auVar108._4_4_ = fVar72;
      auVar108._0_4_ = fVar72;
      auVar108._8_4_ = fVar72;
      auVar108._12_4_ = fVar72;
      auVar108._16_4_ = fVar72;
      auVar108._20_4_ = fVar72;
      auVar108._24_4_ = fVar72;
      auVar108._28_4_ = fVar72;
      fVar3 = (ray->org).field_0.m128[1];
      auVar71._4_4_ = fVar3;
      auVar71._0_4_ = fVar3;
      auVar71._8_4_ = fVar3;
      auVar71._12_4_ = fVar3;
      auVar71._16_4_ = fVar3;
      auVar71._20_4_ = fVar3;
      auVar71._24_4_ = fVar3;
      auVar71._28_4_ = fVar3;
      auVar47._0_4_ = auVar54._0_4_ * 1.0000004;
      auVar47._4_4_ = auVar54._4_4_ * 1.0000004;
      auVar47._8_4_ = auVar54._8_4_ * 1.0000004;
      auVar47._12_4_ = auVar54._12_4_ * 1.0000004;
      fVar4 = (ray->org).field_0.m128[2];
      auVar106._4_4_ = fVar4;
      auVar106._0_4_ = fVar4;
      auVar106._8_4_ = fVar4;
      auVar106._12_4_ = fVar4;
      auVar106._16_4_ = fVar4;
      auVar106._20_4_ = fVar4;
      auVar106._24_4_ = fVar4;
      auVar106._28_4_ = fVar4;
      auVar58 = vshufps_avx(auVar65,auVar65,0);
      auVar54 = vmovshdup_avx(auVar65);
      auVar62 = vshufps_avx(auVar65,auVar65,0x55);
      auVar55 = vshufpd_avx(auVar65,auVar65,1);
      auVar70 = vshufps_avx(auVar65,auVar65,0xaa);
      auVar63 = vshufps_avx(auVar47,auVar47,0);
      uVar29 = (ulong)(auVar65._0_4_ < 0.0) * 0x20;
      auVar64 = vshufps_avx(auVar47,auVar47,0x55);
      auVar47 = vshufps_avx(auVar47,auVar47,0xaa);
      uVar31 = (ulong)(auVar54._0_4_ < 0.0) << 5 | 0x40;
      uVar30 = (ulong)(auVar55._0_4_ < 0.0) << 5 | 0x80;
      auVar54 = vshufps_avx(auVar75,auVar75,0);
      auVar60._16_16_ = auVar54;
      auVar60._0_16_ = auVar54;
      auVar54 = vshufps_avx(ZEXT416((uint)fVar37),ZEXT416((uint)fVar37),0);
      auVar104._16_16_ = auVar54;
      auVar104._0_16_ = auVar54;
      do {
        if (pNVar28 == stack) {
          return;
        }
        uVar24 = pNVar28[-1].ptr;
        pNVar28 = pNVar28 + -1;
        do {
          if ((uVar24 & 0xf) == 0) {
            auVar7 = vsubps_avx(*(undefined1 (*) [32])(uVar24 + 0x40 + uVar29),auVar108);
            auVar10._4_4_ = auVar58._4_4_ * auVar7._4_4_;
            auVar10._0_4_ = auVar58._0_4_ * auVar7._0_4_;
            auVar10._8_4_ = auVar58._8_4_ * auVar7._8_4_;
            auVar10._12_4_ = auVar58._12_4_ * auVar7._12_4_;
            auVar10._16_4_ = auVar58._0_4_ * auVar7._16_4_;
            auVar10._20_4_ = auVar58._4_4_ * auVar7._20_4_;
            auVar10._24_4_ = auVar58._8_4_ * auVar7._24_4_;
            auVar10._28_4_ = auVar7._28_4_;
            auVar7 = vsubps_avx(*(undefined1 (*) [32])(uVar24 + 0x40 + uVar31),auVar71);
            auVar11._4_4_ = auVar62._4_4_ * auVar7._4_4_;
            auVar11._0_4_ = auVar62._0_4_ * auVar7._0_4_;
            auVar11._8_4_ = auVar62._8_4_ * auVar7._8_4_;
            auVar11._12_4_ = auVar62._12_4_ * auVar7._12_4_;
            auVar11._16_4_ = auVar62._0_4_ * auVar7._16_4_;
            auVar11._20_4_ = auVar62._4_4_ * auVar7._20_4_;
            auVar11._24_4_ = auVar62._8_4_ * auVar7._24_4_;
            auVar11._28_4_ = auVar7._28_4_;
            auVar7 = vmaxps_avx(auVar10,auVar11);
            auVar36 = vsubps_avx(*(undefined1 (*) [32])(uVar24 + 0x40 + uVar30),auVar106);
            auVar12._4_4_ = auVar70._4_4_ * auVar36._4_4_;
            auVar12._0_4_ = auVar70._0_4_ * auVar36._0_4_;
            auVar12._8_4_ = auVar70._8_4_ * auVar36._8_4_;
            auVar12._12_4_ = auVar70._12_4_ * auVar36._12_4_;
            auVar12._16_4_ = auVar70._0_4_ * auVar36._16_4_;
            auVar12._20_4_ = auVar70._4_4_ * auVar36._20_4_;
            auVar12._24_4_ = auVar70._8_4_ * auVar36._24_4_;
            auVar12._28_4_ = auVar36._28_4_;
            auVar36 = vsubps_avx(*(undefined1 (*) [32])(uVar24 + 0x40 + (uVar29 ^ 0x20)),auVar108);
            auVar13._4_4_ = auVar63._4_4_ * auVar36._4_4_;
            auVar13._0_4_ = auVar63._0_4_ * auVar36._0_4_;
            auVar13._8_4_ = auVar63._8_4_ * auVar36._8_4_;
            auVar13._12_4_ = auVar63._12_4_ * auVar36._12_4_;
            auVar13._16_4_ = auVar63._0_4_ * auVar36._16_4_;
            auVar13._20_4_ = auVar63._4_4_ * auVar36._20_4_;
            auVar13._24_4_ = auVar63._8_4_ * auVar36._24_4_;
            auVar13._28_4_ = auVar36._28_4_;
            auVar36 = vsubps_avx(*(undefined1 (*) [32])(uVar24 + 0x40 + (uVar31 ^ 0x20)),auVar71);
            auVar14._4_4_ = auVar64._4_4_ * auVar36._4_4_;
            auVar14._0_4_ = auVar64._0_4_ * auVar36._0_4_;
            auVar14._8_4_ = auVar64._8_4_ * auVar36._8_4_;
            auVar14._12_4_ = auVar64._12_4_ * auVar36._12_4_;
            auVar14._16_4_ = auVar64._0_4_ * auVar36._16_4_;
            auVar14._20_4_ = auVar64._4_4_ * auVar36._20_4_;
            auVar14._24_4_ = auVar64._8_4_ * auVar36._24_4_;
            auVar14._28_4_ = auVar36._28_4_;
            auVar6 = vminps_avx(auVar13,auVar14);
            auVar36 = vsubps_avx(*(undefined1 (*) [32])(uVar24 + 0x40 + (uVar30 ^ 0x20)),auVar106);
            auVar15._4_4_ = auVar47._4_4_ * auVar36._4_4_;
            auVar15._0_4_ = auVar47._0_4_ * auVar36._0_4_;
            auVar15._8_4_ = auVar47._8_4_ * auVar36._8_4_;
            auVar15._12_4_ = auVar47._12_4_ * auVar36._12_4_;
            auVar15._16_4_ = auVar47._0_4_ * auVar36._16_4_;
            auVar15._20_4_ = auVar47._4_4_ * auVar36._20_4_;
            auVar15._24_4_ = auVar47._8_4_ * auVar36._24_4_;
            auVar15._28_4_ = auVar36._28_4_;
            auVar36 = vmaxps_avx(auVar12,auVar60);
            auVar7 = vmaxps_avx(auVar7,auVar36);
            auVar36 = vminps_avx(auVar15,auVar104);
            auVar36 = vminps_avx(auVar6,auVar36);
            auVar7 = vcmpps_avx(auVar7,auVar36,2);
LAB_00302e26:
            uVar32 = vmovmskps_avx(auVar7);
            unaff_R15 = CONCAT44((int)(unaff_R15 >> 0x20),uVar32);
            bVar20 = true;
          }
          else {
            if ((int)(uVar24 & 0xf) == 2) {
              uVar23 = uVar24 & 0xfffffffffffffff0;
              fVar37 = *(float *)(uVar23 + 0xbc);
              auVar87._0_4_ =
                   fVar1 * *(float *)(uVar23 + 0xa0) + fVar2 * *(float *)(uVar23 + 0x100) +
                   fVar68 * *(float *)(uVar23 + 0x40);
              auVar87._4_4_ =
                   fVar1 * *(float *)(uVar23 + 0xa4) + fVar2 * *(float *)(uVar23 + 0x104) +
                   fVar68 * *(float *)(uVar23 + 0x44);
              auVar87._8_4_ =
                   fVar1 * *(float *)(uVar23 + 0xa8) + fVar2 * *(float *)(uVar23 + 0x108) +
                   fVar68 * *(float *)(uVar23 + 0x48);
              auVar87._12_4_ =
                   fVar1 * *(float *)(uVar23 + 0xac) + fVar2 * *(float *)(uVar23 + 0x10c) +
                   fVar68 * *(float *)(uVar23 + 0x4c);
              auVar87._16_4_ =
                   fVar1 * *(float *)(uVar23 + 0xb0) + fVar2 * *(float *)(uVar23 + 0x110) +
                   fVar68 * *(float *)(uVar23 + 0x50);
              auVar87._20_4_ =
                   fVar1 * *(float *)(uVar23 + 0xb4) + fVar2 * *(float *)(uVar23 + 0x114) +
                   fVar68 * *(float *)(uVar23 + 0x54);
              auVar87._24_4_ =
                   fVar1 * *(float *)(uVar23 + 0xb8) + fVar2 * *(float *)(uVar23 + 0x118) +
                   fVar68 * *(float *)(uVar23 + 0x58);
              auVar87._28_4_ = auVar70._12_4_ + fVar3 + fVar1;
              auVar96._0_4_ =
                   fVar2 * *(float *)(uVar23 + 0x120) + fVar1 * *(float *)(uVar23 + 0xc0) +
                   fVar68 * *(float *)(uVar23 + 0x60);
              auVar96._4_4_ =
                   fVar2 * *(float *)(uVar23 + 0x124) + fVar1 * *(float *)(uVar23 + 0xc4) +
                   fVar68 * *(float *)(uVar23 + 100);
              auVar96._8_4_ =
                   fVar2 * *(float *)(uVar23 + 0x128) + fVar1 * *(float *)(uVar23 + 200) +
                   fVar68 * *(float *)(uVar23 + 0x68);
              auVar96._12_4_ =
                   fVar2 * *(float *)(uVar23 + 300) + fVar1 * *(float *)(uVar23 + 0xcc) +
                   fVar68 * *(float *)(uVar23 + 0x6c);
              auVar96._16_4_ =
                   fVar2 * *(float *)(uVar23 + 0x130) + fVar1 * *(float *)(uVar23 + 0xd0) +
                   fVar68 * *(float *)(uVar23 + 0x70);
              auVar96._20_4_ =
                   fVar2 * *(float *)(uVar23 + 0x134) + fVar1 * *(float *)(uVar23 + 0xd4) +
                   fVar68 * *(float *)(uVar23 + 0x74);
              auVar96._24_4_ =
                   fVar2 * *(float *)(uVar23 + 0x138) + fVar1 * *(float *)(uVar23 + 0xd8) +
                   fVar68 * *(float *)(uVar23 + 0x78);
              auVar96._28_4_ = auVar58._12_4_ + auVar47._12_4_ + fVar1;
              auVar77._0_4_ =
                   fVar2 * *(float *)(uVar23 + 0x140) + fVar1 * *(float *)(uVar23 + 0xe0) +
                   fVar68 * *(float *)(uVar23 + 0x80);
              auVar77._4_4_ =
                   fVar2 * *(float *)(uVar23 + 0x144) + fVar1 * *(float *)(uVar23 + 0xe4) +
                   fVar68 * *(float *)(uVar23 + 0x84);
              auVar77._8_4_ =
                   fVar2 * *(float *)(uVar23 + 0x148) + fVar1 * *(float *)(uVar23 + 0xe8) +
                   fVar68 * *(float *)(uVar23 + 0x88);
              auVar77._12_4_ =
                   fVar2 * *(float *)(uVar23 + 0x14c) + fVar1 * *(float *)(uVar23 + 0xec) +
                   fVar68 * *(float *)(uVar23 + 0x8c);
              auVar77._16_4_ =
                   fVar2 * *(float *)(uVar23 + 0x150) + fVar1 * *(float *)(uVar23 + 0xf0) +
                   fVar68 * *(float *)(uVar23 + 0x90);
              auVar77._20_4_ =
                   fVar2 * *(float *)(uVar23 + 0x154) + fVar1 * *(float *)(uVar23 + 0xf4) +
                   fVar68 * *(float *)(uVar23 + 0x94);
              auVar77._24_4_ =
                   fVar2 * *(float *)(uVar23 + 0x158) + fVar1 * *(float *)(uVar23 + 0xf8) +
                   fVar68 * *(float *)(uVar23 + 0x98);
              auVar77._28_4_ = auVar62._12_4_ + fVar1 + fVar1;
              auVar105._8_4_ = 0x7fffffff;
              auVar105._0_8_ = 0x7fffffff7fffffff;
              auVar105._12_4_ = 0x7fffffff;
              auVar105._16_4_ = 0x7fffffff;
              auVar105._20_4_ = 0x7fffffff;
              auVar105._24_4_ = 0x7fffffff;
              auVar105._28_4_ = 0x7fffffff;
              auVar7 = vandps_avx(auVar87,auVar105);
              auVar34._8_4_ = 0x219392ef;
              auVar34._0_8_ = 0x219392ef219392ef;
              auVar34._12_4_ = 0x219392ef;
              auVar34._16_4_ = 0x219392ef;
              auVar34._20_4_ = 0x219392ef;
              auVar34._24_4_ = 0x219392ef;
              auVar34._28_4_ = 0x219392ef;
              auVar7 = vcmpps_avx(auVar7,auVar34,1);
              auVar36 = vblendvps_avx(auVar87,auVar34,auVar7);
              auVar7 = vandps_avx(auVar96,auVar105);
              auVar7 = vcmpps_avx(auVar7,auVar34,1);
              auVar6 = vblendvps_avx(auVar96,auVar34,auVar7);
              auVar7 = vandps_avx(auVar77,auVar105);
              auVar7 = vcmpps_avx(auVar7,auVar34,1);
              auVar7 = vblendvps_avx(auVar77,auVar34,auVar7);
              auVar34 = vrcpps_avx(auVar36);
              fVar74 = auVar34._0_4_;
              fVar78 = auVar34._4_4_;
              auVar8._4_4_ = fVar78 * auVar36._4_4_;
              auVar8._0_4_ = fVar74 * auVar36._0_4_;
              fVar79 = auVar34._8_4_;
              auVar8._8_4_ = fVar79 * auVar36._8_4_;
              fVar80 = auVar34._12_4_;
              auVar8._12_4_ = fVar80 * auVar36._12_4_;
              fVar81 = auVar34._16_4_;
              auVar8._16_4_ = fVar81 * auVar36._16_4_;
              fVar82 = auVar34._20_4_;
              auVar8._20_4_ = fVar82 * auVar36._20_4_;
              fVar83 = auVar34._24_4_;
              auVar8._24_4_ = fVar83 * auVar36._24_4_;
              auVar8._28_4_ = auVar36._28_4_;
              auVar35._8_4_ = 0x3f800000;
              auVar35._0_8_ = &DAT_3f8000003f800000;
              auVar35._12_4_ = 0x3f800000;
              auVar35._16_4_ = 0x3f800000;
              auVar35._20_4_ = 0x3f800000;
              auVar35._24_4_ = 0x3f800000;
              auVar35._28_4_ = 0x3f800000;
              auVar8 = vsubps_avx(auVar35,auVar8);
              fVar74 = fVar74 + fVar74 * auVar8._0_4_;
              fVar78 = fVar78 + fVar78 * auVar8._4_4_;
              fVar79 = fVar79 + fVar79 * auVar8._8_4_;
              fVar80 = fVar80 + fVar80 * auVar8._12_4_;
              fVar81 = fVar81 + fVar81 * auVar8._16_4_;
              fVar82 = fVar82 + fVar82 * auVar8._20_4_;
              fVar83 = fVar83 + fVar83 * auVar8._24_4_;
              auVar36 = vrcpps_avx(auVar6);
              fVar84 = auVar36._0_4_;
              fVar88 = auVar36._4_4_;
              auVar9._4_4_ = fVar88 * auVar6._4_4_;
              auVar9._0_4_ = fVar84 * auVar6._0_4_;
              fVar89 = auVar36._8_4_;
              auVar9._8_4_ = fVar89 * auVar6._8_4_;
              fVar90 = auVar36._12_4_;
              auVar9._12_4_ = fVar90 * auVar6._12_4_;
              fVar91 = auVar36._16_4_;
              auVar9._16_4_ = fVar91 * auVar6._16_4_;
              fVar92 = auVar36._20_4_;
              auVar9._20_4_ = fVar92 * auVar6._20_4_;
              fVar93 = auVar36._24_4_;
              auVar9._24_4_ = fVar93 * auVar6._24_4_;
              auVar9._28_4_ = auVar6._28_4_;
              auVar9 = vsubps_avx(auVar35,auVar9);
              fVar84 = fVar84 + fVar84 * auVar9._0_4_;
              fVar88 = fVar88 + fVar88 * auVar9._4_4_;
              fVar89 = fVar89 + fVar89 * auVar9._8_4_;
              fVar90 = fVar90 + fVar90 * auVar9._12_4_;
              fVar91 = fVar91 + fVar91 * auVar9._16_4_;
              fVar92 = fVar92 + fVar92 * auVar9._20_4_;
              fVar93 = fVar93 + fVar93 * auVar9._24_4_;
              auVar6 = vrcpps_avx(auVar7);
              fVar94 = auVar6._0_4_;
              fVar98 = auVar6._4_4_;
              auVar16._4_4_ = fVar98 * auVar7._4_4_;
              auVar16._0_4_ = fVar94 * auVar7._0_4_;
              fVar99 = auVar6._8_4_;
              auVar16._8_4_ = fVar99 * auVar7._8_4_;
              fVar100 = auVar6._12_4_;
              auVar16._12_4_ = fVar100 * auVar7._12_4_;
              fVar101 = auVar6._16_4_;
              auVar16._16_4_ = fVar101 * auVar7._16_4_;
              fVar102 = auVar6._20_4_;
              auVar16._20_4_ = fVar102 * auVar7._20_4_;
              fVar103 = auVar6._24_4_;
              auVar16._24_4_ = fVar103 * auVar7._24_4_;
              auVar16._28_4_ = auVar7._28_4_;
              auVar7 = vsubps_avx(auVar35,auVar16);
              fVar94 = fVar94 + fVar94 * auVar7._0_4_;
              fVar98 = fVar98 + fVar98 * auVar7._4_4_;
              fVar99 = fVar99 + fVar99 * auVar7._8_4_;
              fVar100 = fVar100 + fVar100 * auVar7._12_4_;
              fVar101 = fVar101 + fVar101 * auVar7._16_4_;
              fVar102 = fVar102 + fVar102 * auVar7._20_4_;
              fVar103 = fVar103 + fVar103 * auVar7._24_4_;
              fVar53 = *(float *)(uVar23 + 0x5c) +
                       fVar37 + *(float *)(uVar23 + 0x11c) + *(float *)(uVar23 + 0x17c);
              auVar48._0_4_ =
                   -fVar74 * (fVar72 * *(float *)(uVar23 + 0x40) +
                             *(float *)(uVar23 + 0xa0) * fVar3 +
                             fVar4 * *(float *)(uVar23 + 0x100) + *(float *)(uVar23 + 0x160));
              auVar48._4_4_ =
                   -fVar78 * (fVar72 * *(float *)(uVar23 + 0x44) +
                             *(float *)(uVar23 + 0xa4) * fVar3 +
                             fVar4 * *(float *)(uVar23 + 0x104) + *(float *)(uVar23 + 0x164));
              auVar48._8_4_ =
                   -fVar79 * (fVar72 * *(float *)(uVar23 + 0x48) +
                             *(float *)(uVar23 + 0xa8) * fVar3 +
                             fVar4 * *(float *)(uVar23 + 0x108) + *(float *)(uVar23 + 0x168));
              auVar48._12_4_ =
                   -fVar80 * (fVar72 * *(float *)(uVar23 + 0x4c) +
                             *(float *)(uVar23 + 0xac) * fVar3 +
                             fVar4 * *(float *)(uVar23 + 0x10c) + *(float *)(uVar23 + 0x16c));
              fVar50 = -fVar81 * (fVar72 * *(float *)(uVar23 + 0x50) +
                                 *(float *)(uVar23 + 0xb0) * fVar3 +
                                 fVar4 * *(float *)(uVar23 + 0x110) + *(float *)(uVar23 + 0x170));
              auVar17._16_4_ = fVar50;
              auVar17._0_16_ = auVar48;
              fVar51 = -fVar82 * (fVar72 * *(float *)(uVar23 + 0x54) +
                                 *(float *)(uVar23 + 0xb4) * fVar3 +
                                 fVar4 * *(float *)(uVar23 + 0x114) + *(float *)(uVar23 + 0x174));
              auVar17._20_4_ = fVar51;
              fVar52 = -fVar83 * (fVar72 * *(float *)(uVar23 + 0x58) +
                                 *(float *)(uVar23 + 0xb8) * fVar3 +
                                 fVar4 * *(float *)(uVar23 + 0x118) + *(float *)(uVar23 + 0x178));
              auVar17._24_4_ = fVar52;
              auVar17._28_4_ = fVar53;
              fVar46 = *(float *)(uVar23 + 0x7c) +
                       fVar37 + *(float *)(uVar23 + 0x13c) + *(float *)(uVar23 + 0x19c);
              auVar41._0_4_ =
                   -fVar84 * (fVar72 * *(float *)(uVar23 + 0x60) +
                             *(float *)(uVar23 + 0xc0) * fVar3 +
                             *(float *)(uVar23 + 0x120) * fVar4 + *(float *)(uVar23 + 0x180));
              auVar41._4_4_ =
                   -fVar88 * (fVar72 * *(float *)(uVar23 + 100) +
                             *(float *)(uVar23 + 0xc4) * fVar3 +
                             *(float *)(uVar23 + 0x124) * fVar4 + *(float *)(uVar23 + 0x184));
              auVar41._8_4_ =
                   -fVar89 * (fVar72 * *(float *)(uVar23 + 0x68) +
                             *(float *)(uVar23 + 200) * fVar3 +
                             *(float *)(uVar23 + 0x128) * fVar4 + *(float *)(uVar23 + 0x188));
              auVar41._12_4_ =
                   -fVar90 * (fVar72 * *(float *)(uVar23 + 0x6c) +
                             *(float *)(uVar23 + 0xcc) * fVar3 +
                             *(float *)(uVar23 + 300) * fVar4 + *(float *)(uVar23 + 0x18c));
              fVar43 = -fVar91 * (fVar72 * *(float *)(uVar23 + 0x70) +
                                 *(float *)(uVar23 + 0xd0) * fVar3 +
                                 *(float *)(uVar23 + 0x130) * fVar4 + *(float *)(uVar23 + 400));
              auVar18._16_4_ = fVar43;
              auVar18._0_16_ = auVar41;
              fVar44 = -fVar92 * (fVar72 * *(float *)(uVar23 + 0x74) +
                                 *(float *)(uVar23 + 0xd4) * fVar3 +
                                 *(float *)(uVar23 + 0x134) * fVar4 + *(float *)(uVar23 + 0x194));
              auVar18._20_4_ = fVar44;
              fVar45 = -fVar93 * (fVar72 * *(float *)(uVar23 + 0x78) +
                                 *(float *)(uVar23 + 0xd8) * fVar3 +
                                 *(float *)(uVar23 + 0x138) * fVar4 + *(float *)(uVar23 + 0x198));
              auVar18._24_4_ = fVar45;
              auVar18._28_4_ = fVar46;
              fVar40 = fVar37 + *(float *)(uVar23 + 0x15c) + *(float *)(uVar23 + 0x1bc) + -0.0;
              auVar33._0_4_ =
                   -fVar94 * (fVar72 * *(float *)(uVar23 + 0x80) +
                             *(float *)(uVar23 + 0xe0) * fVar3 +
                             *(float *)(uVar23 + 0x140) * fVar4 + *(float *)(uVar23 + 0x1a0));
              auVar33._4_4_ =
                   -fVar98 * (fVar72 * *(float *)(uVar23 + 0x84) +
                             *(float *)(uVar23 + 0xe4) * fVar3 +
                             *(float *)(uVar23 + 0x144) * fVar4 + *(float *)(uVar23 + 0x1a4));
              auVar33._8_4_ =
                   -fVar99 * (fVar72 * *(float *)(uVar23 + 0x88) +
                             *(float *)(uVar23 + 0xe8) * fVar3 +
                             *(float *)(uVar23 + 0x148) * fVar4 + *(float *)(uVar23 + 0x1a8));
              auVar33._12_4_ =
                   -fVar100 *
                   (fVar72 * *(float *)(uVar23 + 0x8c) +
                   *(float *)(uVar23 + 0xec) * fVar3 +
                   *(float *)(uVar23 + 0x14c) * fVar4 + *(float *)(uVar23 + 0x1ac));
              fVar37 = -fVar101 *
                       (fVar72 * *(float *)(uVar23 + 0x90) +
                       *(float *)(uVar23 + 0xf0) * fVar3 +
                       *(float *)(uVar23 + 0x150) * fVar4 + *(float *)(uVar23 + 0x1b0));
              auVar19._16_4_ = fVar37;
              auVar19._0_16_ = auVar33;
              fVar38 = -fVar102 *
                       (fVar72 * *(float *)(uVar23 + 0x94) +
                       *(float *)(uVar23 + 0xf4) * fVar3 +
                       *(float *)(uVar23 + 0x154) * fVar4 + *(float *)(uVar23 + 0x1b4));
              auVar19._20_4_ = fVar38;
              fVar39 = -fVar103 *
                       (fVar72 * *(float *)(uVar23 + 0x98) +
                       *(float *)(uVar23 + 0xf8) * fVar3 +
                       *(float *)(uVar23 + 0x158) * fVar4 + *(float *)(uVar23 + 0x1b8));
              auVar19._24_4_ = fVar39;
              auVar19._28_4_ = fVar40;
              auVar59._0_4_ = fVar74 + auVar48._0_4_;
              auVar59._4_4_ = fVar78 + auVar48._4_4_;
              auVar59._8_4_ = fVar79 + auVar48._8_4_;
              auVar59._12_4_ = fVar80 + auVar48._12_4_;
              auVar61._16_4_ = fVar81 + fVar50;
              auVar61._0_16_ = auVar59;
              auVar61._20_4_ = fVar82 + fVar51;
              auVar61._24_4_ = fVar83 + fVar52;
              auVar61._28_4_ = auVar34._28_4_ + auVar8._28_4_ + fVar53;
              auVar66._0_4_ = fVar84 + auVar41._0_4_;
              auVar66._4_4_ = fVar88 + auVar41._4_4_;
              auVar66._8_4_ = fVar89 + auVar41._8_4_;
              auVar66._12_4_ = fVar90 + auVar41._12_4_;
              auVar67._16_4_ = fVar91 + fVar43;
              auVar67._0_16_ = auVar66;
              auVar67._20_4_ = fVar92 + fVar44;
              auVar67._24_4_ = fVar93 + fVar45;
              auVar67._28_4_ = auVar36._28_4_ + auVar9._28_4_ + fVar46;
              auVar56._0_4_ = fVar94 + auVar33._0_4_;
              auVar56._4_4_ = fVar98 + auVar33._4_4_;
              auVar56._8_4_ = fVar99 + auVar33._8_4_;
              auVar56._12_4_ = fVar100 + auVar33._12_4_;
              auVar57._16_4_ = fVar101 + fVar37;
              auVar57._0_16_ = auVar56;
              auVar57._20_4_ = fVar102 + fVar38;
              auVar57._24_4_ = fVar103 + fVar39;
              auVar57._28_4_ = auVar6._28_4_ + auVar7._28_4_ + fVar40;
              auVar54 = vpminsd_avx(auVar17._16_16_,auVar61._16_16_);
              auVar55 = vpminsd_avx(auVar48,auVar59);
              auVar73._16_16_ = auVar54;
              auVar73._0_16_ = auVar55;
              auVar54 = vpminsd_avx(auVar18._16_16_,auVar67._16_16_);
              auVar55 = vpminsd_avx(auVar41,auVar66);
              auVar97._16_16_ = auVar54;
              auVar97._0_16_ = auVar55;
              auVar54 = vpminsd_avx(auVar19._16_16_,auVar57._16_16_);
              auVar55 = vpminsd_avx(auVar33,auVar56);
              auVar107._16_16_ = auVar54;
              auVar107._0_16_ = auVar55;
              auVar7 = vmaxps_avx(auVar97,auVar107);
              auVar54 = vpmaxsd_avx(auVar17._16_16_,auVar61._16_16_);
              auVar55 = vpmaxsd_avx(auVar48,auVar59);
              auVar49._16_16_ = auVar54;
              auVar49._0_16_ = auVar55;
              auVar54 = vpmaxsd_avx(auVar18._16_16_,auVar67._16_16_);
              auVar55 = vpmaxsd_avx(auVar41,auVar66);
              auVar42._16_16_ = auVar54;
              auVar42._0_16_ = auVar55;
              auVar54 = vpmaxsd_avx(auVar19._16_16_,auVar57._16_16_);
              auVar55 = vpmaxsd_avx(auVar33,auVar56);
              auVar36._16_16_ = auVar54;
              auVar36._0_16_ = auVar55;
              auVar6 = vminps_avx(auVar42,auVar36);
              auVar36 = vmaxps_avx(auVar60,auVar73);
              auVar7 = vmaxps_avx(auVar36,auVar7);
              auVar36 = vminps_avx(auVar104,auVar49);
              auVar36 = vminps_avx(auVar36,auVar6);
              auVar6._4_4_ = auVar7._4_4_ * 0.99999964;
              auVar6._0_4_ = auVar7._0_4_ * 0.99999964;
              auVar6._8_4_ = auVar7._8_4_ * 0.99999964;
              auVar6._12_4_ = auVar7._12_4_ * 0.99999964;
              auVar6._16_4_ = auVar7._16_4_ * 0.99999964;
              auVar6._20_4_ = auVar7._20_4_ * 0.99999964;
              auVar6._24_4_ = auVar7._24_4_ * 0.99999964;
              auVar6._28_4_ = auVar7._28_4_;
              auVar7._4_4_ = auVar36._4_4_ * 1.0000004;
              auVar7._0_4_ = auVar36._0_4_ * 1.0000004;
              auVar7._8_4_ = auVar36._8_4_ * 1.0000004;
              auVar7._12_4_ = auVar36._12_4_ * 1.0000004;
              auVar7._16_4_ = auVar36._16_4_ * 1.0000004;
              auVar7._20_4_ = auVar36._20_4_ * 1.0000004;
              auVar7._24_4_ = auVar36._24_4_ * 1.0000004;
              auVar7._28_4_ = auVar36._28_4_;
              auVar7 = vcmpps_avx(auVar6,auVar7,2);
              goto LAB_00302e26;
            }
            bVar20 = false;
          }
          if (bVar20) {
            if (unaff_R15 == 0) {
              iVar25 = 4;
            }
            else {
              uVar23 = uVar24 & 0xfffffffffffffff0;
              lVar27 = 0;
              if (unaff_R15 != 0) {
                for (; (unaff_R15 >> lVar27 & 1) == 0; lVar27 = lVar27 + 1) {
                }
              }
              iVar25 = 0;
              uVar24 = *(ulong *)(uVar23 + lVar27 * 8);
              uVar26 = unaff_R15 - 1 & unaff_R15;
              if (uVar26 != 0) {
                pNVar28->ptr = uVar24;
                lVar27 = 0;
                if (uVar26 != 0) {
                  for (; (uVar26 >> lVar27 & 1) == 0; lVar27 = lVar27 + 1) {
                  }
                }
                uVar22 = uVar26 - 1;
                while( true ) {
                  pNVar28 = pNVar28 + 1;
                  uVar24 = *(ulong *)(uVar23 + lVar27 * 8);
                  uVar22 = uVar22 & uVar26;
                  if (uVar22 == 0) break;
                  pNVar28->ptr = uVar24;
                  lVar27 = 0;
                  if (uVar22 != 0) {
                    for (; (uVar22 >> lVar27 & 1) == 0; lVar27 = lVar27 + 1) {
                    }
                  }
                  uVar26 = uVar22 - 1;
                }
              }
            }
          }
          else {
            iVar25 = 6;
          }
        } while (iVar25 == 0);
        if (iVar25 == 6) {
          cVar21 = (**(code **)((long)This->leafIntersector +
                               (ulong)*(byte *)(uVar24 & 0xfffffffffffffff0) * 0x40 + 8))
                             (&pre,ray,context);
          iVar25 = 0;
          if (cVar21 != '\0') {
            ray->tfar = -INFINITY;
            iVar25 = 3;
          }
        }
      } while (iVar25 != 3);
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::occluded(const Accel::Intersectors* __restrict__ This,
                                                                             Ray& __restrict__ ray,
                                                                             RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
       
      /* early out for already occluded rays */
      if (unlikely(ray.tfar < 0.0f))
        return;

      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      NodeRef stack[stackSize];    // stack of nodes that still need to get traversed
      NodeRef* stackPtr = stack+1; // current stack pointer
      NodeRef* stackEnd = stack+stackSize;
      stack[0] = bvh->root;

      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif

      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = (NodeRef)*stackPtr;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(shadow.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(shadow.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        if (PrimitiveIntersector1::occluded(This, pre, ray, context, prim, num, tray, lazy_node)) {
          ray.tfar = neg_inf;
          break;
        }

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          *stackPtr = (NodeRef)lazy_node;
          stackPtr++;
        }
      }
    }